

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Action<test_result_(char)>::Perform(Action<test_result_(char)> *this,ArgumentTuple *args)

{
  ActionInterface<test_result_(char)> *pAVar1;
  allocator local_41;
  string local_40;
  
  pAVar1 = (this->impl_).value_;
  std::__cxx11::string::string
            ((string *)&local_40,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_41);
  internal::Assert(pAVar1 != (ActionInterface<test_result_(char)> *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gmock/gmock.h"
                   ,0x4c8,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar1 = (this->impl_).value_;
  (*pAVar1->_vptr_ActionInterface[2])(pAVar1,args);
  return;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }